

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::FieldOptions::_InternalSerialize
          (FieldOptions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  bool bVar1;
  uint uVar2;
  FeatureSet *value;
  FieldOptions_FeatureSupport *value_00;
  int iVar3;
  const_reference piVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldOptions_EditionDefault>_>
  *value_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *value_02;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  int iVar9;
  
  uVar2 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar2 & 4) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (ulong)(this->field_0)._impl_.ctype_;
    pbVar8 = target + 1;
    *target = '\b';
    uVar7 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar8 = (byte)uVar7 | 0x80;
        uVar6 = uVar7 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar6;
      } while (bVar1);
    }
    *pbVar8 = (byte)uVar6;
    target = pbVar8 + 1;
  }
  if ((uVar2 & 8) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.packed_;
    *target = 0x10;
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar2 & 0x10) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.deprecated_;
    *target = 0x18;
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar2 & 0x20) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.lazy_;
    *target = 0x28;
    target[1] = bVar1;
    target = target + 2;
  }
  if ((char)uVar2 < '\0') {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (ulong)(this->field_0)._impl_.jstype_;
    pbVar8 = target + 1;
    *target = 0x30;
    uVar7 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar8 = (byte)uVar7 | 0x80;
        uVar6 = uVar7 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar6;
      } while (bVar1);
    }
    *pbVar8 = (byte)uVar6;
    target = pbVar8 + 1;
  }
  if ((uVar2 & 0x40) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.weak_;
    *target = 0x50;
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar2 >> 8 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.unverified_lazy_;
    *target = 0x78;
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar2 >> 9 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.debug_redact_;
    target[0] = 0x80;
    target[1] = 1;
    target[2] = bVar1;
    target = target + 3;
  }
  if ((uVar2 >> 10 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (ulong)(this->field_0)._impl_.retention_;
    pbVar8 = target + 2;
    target[0] = 0x88;
    target[1] = 1;
    uVar7 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar8 = (byte)uVar7 | 0x80;
        uVar6 = uVar7 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar6;
      } while (bVar1);
    }
    *pbVar8 = (byte)uVar6;
    target = pbVar8 + 1;
  }
  this_00 = &(this->field_0)._impl_.targets_;
  iVar3 = internal::SooRep::size
                    (&this_00->soo_rep_,(*(byte *)((long)&this->field_0 + 0x20) & 4) == 0);
  if (0 < iVar3) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar4 = RepeatedField<int>::Get(this_00,iVar9);
      uVar6 = (ulong)*piVar4;
      pbVar8 = target + 2;
      target[0] = 0x98;
      target[1] = 1;
      uVar7 = uVar6;
      if (0x7f < uVar6) {
        do {
          *pbVar8 = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar1 = 0x3fff < uVar7;
          uVar7 = uVar6;
        } while (bVar1);
      }
      *pbVar8 = (byte)uVar6;
      target = pbVar8 + 1;
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar3);
  }
  iVar3 = *(int *)((long)&this->field_0 + 0x38);
  if (iVar3 != 0) {
    iVar9 = 0;
    do {
      value_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldOptions_EditionDefault>>
                           (&(this->field_0)._impl_.edition_defaults_.super_RepeatedPtrFieldBase,
                            iVar9);
      target = internal::WireFormatLite::InternalWriteMessage
                         (0x14,(MessageLite *)value_01,
                          (value_01->field_0)._impl_._cached_size_.atom_,target,stream);
      iVar9 = iVar9 + 1;
    } while (iVar3 != iVar9);
  }
  if ((uVar2 & 1) != 0) {
    value = (this->field_0)._impl_.features_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (0x15,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target
                        ,stream);
  }
  if ((uVar2 & 2) != 0) {
    value_00 = (this->field_0)._impl_.feature_support_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (0x16,(MessageLite *)value_00,*(int *)((long)&value_00->field_0 + 4),target,
                        stream);
  }
  iVar3 = *(int *)((long)&this->field_0 + 0x50);
  if (iVar3 != 0) {
    iVar9 = 0;
    do {
      value_02 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                           (&(this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase
                            ,iVar9);
      target = internal::WireFormatLite::InternalWriteMessage
                         (999,(MessageLite *)value_02,(value_02->field_0)._impl_._cached_size_.atom_
                          ,target,stream);
      iVar9 = iVar9 + 1;
    } while (iVar3 != iVar9);
  }
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    target = internal::ExtensionSet::_InternalSerializeAllImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_FieldOptions_default_instance_,target,stream);
  }
  uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    puVar5 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar7 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar5;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FieldOptions::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FieldOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldOptions)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_ctype(), target);
  }

  // optional bool packed = 2;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        2, this_._internal_packed(), target);
  }

  // optional bool deprecated = 3 [default = false];
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        3, this_._internal_deprecated(), target);
  }

  // optional bool lazy = 5 [default = false];
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        5, this_._internal_lazy(), target);
  }

  // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        6, this_._internal_jstype(), target);
  }

  // optional bool weak = 10 [default = false];
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        10, this_._internal_weak(), target);
  }

  // optional bool unverified_lazy = 15 [default = false];
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        15, this_._internal_unverified_lazy(), target);
  }

  // optional bool debug_redact = 16 [default = false];
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        16, this_._internal_debug_redact(), target);
  }

  // optional .google.protobuf.FieldOptions.OptionRetention retention = 17;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        17, this_._internal_retention(), target);
  }

  // repeated .google.protobuf.FieldOptions.OptionTargetType targets = 19;
  for (int i = 0, n = this_._internal_targets_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        19, static_cast<::google::protobuf::FieldOptions_OptionTargetType>(this_._internal_targets().Get(i)),
        target);
  }

  // repeated .google.protobuf.FieldOptions.EditionDefault edition_defaults = 20;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_edition_defaults_size());
       i < n; i++) {
    const auto& repfield = this_._internal_edition_defaults().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            20, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // optional .google.protobuf.FeatureSet features = 21;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        21, *this_._impl_.features_, this_._impl_.features_->GetCachedSize(), target,
        stream);
  }

  // optional .google.protobuf.FieldOptions.FeatureSupport feature_support = 22;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        22, *this_._impl_.feature_support_, this_._impl_.feature_support_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_uninterpreted_option_size());
       i < n; i++) {
    const auto& repfield = this_._internal_uninterpreted_option().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            999, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldOptions)
  return target;
}